

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall GLDrawList::SortSpriteIntoWall(GLDrawList *this,SortNode *head,SortNode *sort)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  GLDrawItem *pGVar7;
  GLWall *pGVar8;
  SortNode *pSVar9;
  SortNode *pSVar10;
  undefined1 auVar11 [16];
  double dVar12;
  uint uVar13;
  SortNode *pSVar14;
  GLSprite *pGVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  GLSprite s;
  double dStack_e0;
  GLSprite local_c0;
  
  pGVar7 = (this->drawitems).Array;
  iVar5 = pGVar7[head->itemindex].index;
  pGVar8 = (this->walls).Array;
  pGVar15 = (this->sprites).Array;
  iVar6 = pGVar7[sort->itemindex].index;
  fVar21 = pGVar8[iVar5].glseg.x1;
  fVar17 = pGVar8[iVar5].glseg.y1;
  fVar16 = pGVar8[iVar5].glseg.y2 - fVar17;
  fVar18 = pGVar8[iVar5].glseg.x2 - fVar21;
  uVar1 = pGVar15[iVar6].x1;
  uVar3 = pGVar15[iVar6].y1;
  uVar2 = pGVar15[iVar6].x2;
  uVar4 = pGVar15[iVar6].y2;
  fVar19 = ((float)uVar1 - fVar21) * fVar16;
  fVar20 = ((float)uVar3 - fVar17) * fVar18;
  fVar22 = fVar19 - fVar20;
  fVar21 = ((float)uVar2 - fVar21) * fVar16 - ((float)uVar4 - fVar17) * fVar18;
  if ((0.0005 <= ABS(fVar22)) || (0.0005 <= ABS(fVar21))) {
    if ((0.0005 <= fVar22) || (0.0005 <= fVar21)) {
      if ((fVar22 <= -0.0005) || (fVar21 <= -0.0005)) {
        pGVar15 = pGVar15 + iVar6;
        dVar12 = (double)((fVar20 - fVar19) /
                         (fVar16 * ((float)uVar2 - (float)uVar1) -
                         fVar18 * ((float)uVar4 - (float)uVar3)));
        auVar11._8_4_ = SUB84((double)(float)uVar3,0);
        auVar11._0_8_ = (double)(float)uVar1;
        auVar11._12_4_ = (int)((ulong)(double)(float)uVar3 >> 0x20);
        fVar21 = (float)((double)(pGVar15->ur - pGVar15->ul) * dVar12 + (double)pGVar15->ul);
        memcpy(&local_c0,pGVar15,0xa0);
        AddSprite(this,&local_c0);
        uVar13 = (this->sprites).Count - 1;
        pGVar15 = (this->sprites).Array;
        iVar5 = (this->drawitems).Array[sort->itemindex].index;
        dStack_e0 = auVar11._8_8_;
        fVar17 = (float)(dVar12 * (double)((float)uVar2 - (float)uVar1) + (double)(float)uVar1);
        fVar16 = (float)(dVar12 * (double)((float)uVar4 - (float)uVar3) + dStack_e0);
        pGVar15[iVar5].x2 = fVar17;
        pGVar15[iVar5].y2 = fVar16;
        pGVar15[uVar13].x1 = fVar17;
        pGVar15[uVar13].y1 = fVar16;
        pGVar15[iVar5].ur = fVar21;
        pGVar15[uVar13].ul = fVar21;
        pSVar14 = StaticSortNodeArray::GetNew(&SortNodes);
        *(undefined8 *)pSVar14 = 0;
        pSVar14->parent = (SortNode *)0x0;
        pSVar14->next = (SortNode *)0x0;
        pSVar14->left = (SortNode *)0x0;
        pSVar14->equal = (SortNode *)0x0;
        pSVar14->right = (SortNode *)0x0;
        pSVar14->itemindex = (this->drawitems).Count - 1;
        if (fVar22 <= 0.0) {
          pSVar9 = sort->parent;
          pSVar10 = sort->next;
          if (pSVar9 != (SortNode *)0x0) {
            pSVar9->next = pSVar10;
          }
          if (pSVar10 != (SortNode *)0x0) {
            pSVar10->parent = pSVar9;
          }
          sort->parent = (SortNode *)0x0;
          sort->next = (SortNode *)0x0;
          pSVar9 = head->left;
          if (pSVar9 != (SortNode *)0x0) {
            sort->parent = pSVar9->parent;
            pSVar9->parent = sort;
            sort->next = pSVar9;
            if (sort->parent != (SortNode *)0x0) {
              sort->parent->next = sort;
            }
          }
          head->left = sort;
          pSVar9 = pSVar14->parent;
          pSVar10 = pSVar14->next;
          if (pSVar9 != (SortNode *)0x0) {
            pSVar9->next = pSVar10;
          }
          if (pSVar10 != (SortNode *)0x0) {
            pSVar10->parent = pSVar9;
          }
          pSVar14->parent = (SortNode *)0x0;
          pSVar14->next = (SortNode *)0x0;
          pSVar9 = head->right;
          if (pSVar9 != (SortNode *)0x0) {
            pSVar14->parent = pSVar9->parent;
            pSVar9->parent = pSVar14;
            pSVar14->next = pSVar9;
            if (pSVar14->parent != (SortNode *)0x0) {
              pSVar14->parent->next = pSVar14;
            }
          }
          head->right = pSVar14;
          return;
        }
        pSVar14->parent = (SortNode *)0x0;
        pSVar14->next = (SortNode *)0x0;
        pSVar9 = head->left;
        if (pSVar9 != (SortNode *)0x0) {
          pSVar14->parent = pSVar9->parent;
          pSVar9->parent = pSVar14;
          pSVar14->next = pSVar9;
          if (pSVar14->parent != (SortNode *)0x0) {
            pSVar14->parent->next = pSVar14;
          }
        }
        head->left = pSVar14;
        pSVar14 = sort->parent;
        pSVar9 = sort->next;
        if (pSVar14 != (SortNode *)0x0) {
          pSVar14->next = pSVar9;
        }
        if (pSVar9 != (SortNode *)0x0) {
          pSVar9->parent = pSVar14;
        }
      }
      else {
        pSVar14 = sort->parent;
        pSVar9 = sort->next;
        if (pSVar14 != (SortNode *)0x0) {
          pSVar14->next = pSVar9;
        }
        if (pSVar9 != (SortNode *)0x0) {
          pSVar9->parent = pSVar14;
        }
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar14 = head->right;
      if (pSVar14 != (SortNode *)0x0) {
        sort->parent = pSVar14->parent;
        pSVar14->parent = sort;
        sort->next = pSVar14;
        if (sort->parent != (SortNode *)0x0) {
          sort->parent->next = sort;
        }
      }
      head->right = sort;
      return;
    }
    pSVar14 = sort->parent;
    pSVar9 = sort->next;
    if (pSVar14 != (SortNode *)0x0) {
      pSVar14->next = pSVar9;
    }
    if (pSVar9 != (SortNode *)0x0) {
      pSVar9->parent = pSVar14;
    }
    sort->parent = (SortNode *)0x0;
    sort->next = (SortNode *)0x0;
  }
  else {
    pSVar14 = sort->parent;
    pSVar9 = sort->next;
    if (pGVar8[iVar5].type != '\x05') {
      if (pSVar14 != (SortNode *)0x0) {
        pSVar14->next = pSVar9;
      }
      if (pSVar9 != (SortNode *)0x0) {
        pSVar9->parent = pSVar14;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      sort->equal = head->equal;
      head->equal = sort;
      return;
    }
    if (pSVar14 != (SortNode *)0x0) {
      pSVar14->next = pSVar9;
    }
    if (pSVar9 != (SortNode *)0x0) {
      pSVar9->parent = pSVar14;
    }
    sort->parent = (SortNode *)0x0;
    sort->next = (SortNode *)0x0;
  }
  pSVar14 = head->left;
  if (pSVar14 != (SortNode *)0x0) {
    sort->parent = pSVar14->parent;
    pSVar14->parent = sort;
    sort->next = pSVar14;
    if (sort->parent != (SortNode *)0x0) {
      sort->parent->next = sort;
    }
  }
  head->left = sort;
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoWall(SortNode * head,SortNode * sort)
{
	GLWall * wh=&walls[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];
	GLSprite * ss1;

	float v1 = wh->PointOnSide(ss->x1, ss->y1);
	float v2 = wh->PointOnSide(ss->x2, ss->y2);

	if (fabs(v1)<MIN_EQ && fabs(v2)<MIN_EQ) 
	{
		if (wh->type==RENDERWALL_FOGBOUNDARY) 
		{
			head->AddToLeft(sort);
		}
		else 
		{
			head->AddToEqual(sort);
		}
	}
	else if (v1<MIN_EQ && v2<MIN_EQ) 
	{
		head->AddToLeft(sort);
	}
	else if (v1>-MIN_EQ && v2>-MIN_EQ) 
	{
		head->AddToRight(sort);
	}
	else
	{
		double r=ss->CalcIntersectionVertex(wh);

		float ix=(float)(ss->x1 + r * (ss->x2-ss->x1));
		float iy=(float)(ss->y1 + r * (ss->y2-ss->y1));
		float iu=(float)(ss->ul + r * (ss->ur-ss->ul));

		GLSprite s=*ss;
		AddSprite(&s);
		ss1=&sprites[sprites.Size()-1];
		ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!

		ss1->x1=ss->x2=ix;
		ss1->y1=ss->y2=iy;
		ss1->ul=ss->ur=iu;

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		if (v1>0)
		{
			head->AddToLeft(sort2);
			head->AddToRight(sort);
		}
		else
		{
			head->AddToLeft(sort);
			head->AddToRight(sort2);
		}
	}
}